

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O2

void __thiscall
btCompoundShape::addChildShape
          (btCompoundShape *this,btTransform *localTransform,btCollisionShape *shape)

{
  btScalar *pbVar1;
  float fVar2;
  int i;
  long lVar3;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btCompoundShapeChild child;
  btDbvtVolume bounds;
  btScalar local_b8 [4];
  btScalar local_a8 [4];
  btCompoundShapeChild local_98;
  btDbvtVolume local_38;
  
  this->m_updateRevision = this->m_updateRevision + 1;
  local_98.m_node = (btDbvtNode *)0x0;
  local_98.m_transform.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(localTransform->m_basis).m_el[0].m_floats;
  local_98.m_transform.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((localTransform->m_basis).m_el[0].m_floats + 2);
  local_98.m_transform.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(localTransform->m_basis).m_el[1].m_floats;
  local_98.m_transform.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((localTransform->m_basis).m_el[1].m_floats + 2);
  local_98.m_transform.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(localTransform->m_basis).m_el[2].m_floats;
  local_98.m_transform.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((localTransform->m_basis).m_el[2].m_floats + 2);
  local_98.m_transform.m_origin.m_floats[0] = (localTransform->m_origin).m_floats[0];
  local_98.m_transform.m_origin.m_floats[1] = (localTransform->m_origin).m_floats[1];
  local_98.m_transform.m_origin.m_floats[2] = (localTransform->m_origin).m_floats[2];
  local_98.m_transform.m_origin.m_floats[3] = (localTransform->m_origin).m_floats[3];
  local_98.m_childShapeType = shape->m_shapeType;
  local_98.m_childShape = shape;
  (*shape->_vptr_btCollisionShape[0xc])(shape);
  (*shape->_vptr_btCollisionShape[2])(shape,localTransform,local_a8,local_b8);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    if (local_a8[lVar3] < (this->m_localAabbMin).m_floats[lVar3]) {
      (this->m_localAabbMin).m_floats[lVar3] = local_a8[lVar3];
    }
    fVar2 = local_b8[lVar3];
    pbVar1 = (this->m_localAabbMax).m_floats + lVar3;
    if (*pbVar1 <= fVar2 && fVar2 != *pbVar1) {
      (this->m_localAabbMax).m_floats[lVar3] = fVar2;
    }
  }
  if (this->m_dynamicAabbTree != (btDbvt *)0x0) {
    local_38.mi.m_floats[0] = local_a8[0];
    local_38.mi.m_floats[1] = local_a8[1];
    local_38.mi.m_floats[2] = local_a8[2];
    local_38.mi.m_floats[3] = local_a8[3];
    local_38.mx.m_floats[0] = local_b8[0];
    local_38.mx.m_floats[1] = local_b8[1];
    local_38.mx.m_floats[2] = local_b8[2];
    local_38.mx.m_floats[3] = local_b8[3];
    local_98.m_node =
         btDbvt::insert(this->m_dynamicAabbTree,&local_38,(void *)(long)(this->m_children).m_size);
  }
  btAlignedObjectArray<btCompoundShapeChild>::push_back(&this->m_children,&local_98);
  return;
}

Assistant:

void	btCompoundShape::addChildShape(const btTransform& localTransform,btCollisionShape* shape)
{
	m_updateRevision++;
	//m_childTransforms.push_back(localTransform);
	//m_childShapes.push_back(shape);
	btCompoundShapeChild child;
	child.m_node = 0;
	child.m_transform = localTransform;
	child.m_childShape = shape;
	child.m_childShapeType = shape->getShapeType();
	child.m_childMargin = shape->getMargin();

	
	//extend the local aabbMin/aabbMax
	btVector3 localAabbMin,localAabbMax;
	shape->getAabb(localTransform,localAabbMin,localAabbMax);
	for (int i=0;i<3;i++)
	{
		if (m_localAabbMin[i] > localAabbMin[i])
		{
			m_localAabbMin[i] = localAabbMin[i];
		}
		if (m_localAabbMax[i] < localAabbMax[i])
		{
			m_localAabbMax[i] = localAabbMax[i];
		}

	}
	if (m_dynamicAabbTree)
	{
		const btDbvtVolume	bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
		size_t index = m_children.size();
		child.m_node = m_dynamicAabbTree->insert(bounds,reinterpret_cast<void*>(index) );
	}

	m_children.push_back(child);

}